

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O2

int ptr_cas(elem_ptr_t *ptr,ll_elem **expect,ll_elem *set)

{
  ll_elem *plVar1;
  ll_elem *plVar2;
  bool bVar4;
  ll_elem *plVar3;
  
  plVar1 = *expect;
  if (((ulong)plVar1 & 1) != 0) {
    __assert_fail("!((uintptr_t)old & DEREF)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0xdb,
                  "int ptr_cas(elem_ptr_t *, struct ll_elem **, struct ll_elem *)");
  }
  plVar2 = plVar1;
  while( true ) {
    LOCK();
    plVar3 = (ll_elem *)*ptr;
    bVar4 = plVar2 == plVar3;
    if (bVar4) {
      *ptr = ((ulong)set & 0xfffffffffffffffc) + (ulong)((uint)plVar1 & 2) + 1;
      plVar3 = plVar2;
    }
    UNLOCK();
    if ((bVar4) || (*expect = plVar3, (ll_elem *)((ulong)plVar3 & 0xfffffffffffffffe) != plVar1))
    break;
    *expect = plVar1;
    plVar2 = *expect;
  }
  return (int)bVar4;
}

Assistant:

static __inline int
ptr_cas(elem_ptr_t *ptr, struct ll_elem **expect, struct ll_elem *set)
{
	struct ll_elem	*old = *expect;
	int		 succes;
	uintptr_t	 set_;

	assert(!((uintptr_t)old & DEREF));
	set_ = (uintptr_t)ptr_ref(flag_combine(set, old));

	for (;;) {
		succes = atomic_compare_exchange_weak_explicit(ptr,
		    (uintptr_t*)expect, set_,
		    memory_order_acq_rel, memory_order_relaxed);
		if (succes)
			break;
		if (((uintptr_t)*expect & ~DEREF) != (uintptr_t)old)
			break;
		*expect = old;
		SPINWAIT();
	}

	return succes;
}